

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::configCommandBuffer
          (TimestampTestInstance *this)

{
  VkPipelineStageFlagBits VVar1;
  VkCommandBuffer_s *pVVar2;
  bool bVar3;
  VkResult VVar4;
  VkCommandBufferInheritanceInfo *pVVar5;
  VkCommandBuffer_s **ppVVar6;
  Handle<(vk::HandleType)11> *pHVar7;
  reference pVVar8;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_58;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_50;
  const_iterator it;
  deUint32 timestampEntry;
  undefined8 local_38;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  DeviceInterface *vk;
  TimestampTestInstance *this_local;
  
  pVVar5 = (VkCommandBufferInheritanceInfo *)
           Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_38 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = pVVar5;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar4 = (*(*(_func_int ***)pVVar5)[0x49])(pVVar5,*ppVVar6,&local_38);
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x2ec);
  pVVar5 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar6;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                     (&(this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>);
  (**(code **)(*(long *)pVVar5 + 0x380))(pVVar5,pVVar2,pHVar7->m_internal,0,8);
  it._M_current._4_4_ = 0;
  local_50._M_current =
       (VkPipelineStageFlagBits *)
       std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::begin
                 (&this->m_stages);
  while( true ) {
    local_58._M_current =
         (VkPipelineStageFlagBits *)
         std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::end
                   (&this->m_stages);
    bVar3 = __gnu_cxx::operator!=(&local_50,&local_58);
    pVVar5 = cmdBufferBeginInfo.pInheritanceInfo;
    if (!bVar3) break;
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar6;
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
             ::operator*(&local_50);
    VVar1 = *pVVar8;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                       (&(this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    (**(code **)(*(long *)pVVar5 + 0x388))(pVVar5,pVVar2,VVar1,pHVar7->m_internal);
    __gnu_cxx::
    __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
    ::operator++(&local_50,0);
  }
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar4 = (**(code **)(*(long *)pVVar5 + 0x250))(pVVar5,*ppVVar6);
  ::vk::checkResult(VVar4,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x2f6);
  return;
}

Assistant:

void TimestampTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCommandBufferUsageFlags        flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	deUint32 timestampEntry = 0;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}